

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

bstring bjoinblk(bstrList *bl,void *blk,int len)

{
  int iVar1;
  bstring ptVar2;
  uchar *puVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  uchar *__dest;
  long lVar8;
  uint uVar9;
  
  if (((bl != (bstrList *)0x0) && (uVar9 = bl->qty, -1 < (int)(uVar9 | len))) &&
     (blk != (void *)0x0 || len == 0)) {
    if (uVar9 == 0) {
      ptVar2 = blk2bstr(anon_var_dwarf_263d0 + 0x10,0);
      return ptVar2;
    }
    uVar5 = 0;
    if (0 < (int)uVar9) {
      uVar5 = (ulong)uVar9;
    }
    uVar4 = 1;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      iVar1 = bl->entry[uVar7]->slen;
      if (iVar1 < 0) {
        return (bstring)0x0;
      }
      if ((int)(uVar4 ^ 0x7fffffff) < iVar1) {
        return (bstring)0x0;
      }
      uVar4 = uVar4 + iVar1;
    }
    ptVar2 = (bstring)malloc(0x10);
    if (len == 0) {
      puVar3 = (uchar *)malloc((ulong)uVar4);
      ptVar2->data = puVar3;
      if (puVar3 != (uchar *)0x0) {
        __dest = puVar3;
        for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
          sVar6 = (size_t)bl->entry[uVar7]->slen;
          memcpy(__dest,bl->entry[uVar7]->data,sVar6);
          __dest = __dest + sVar6;
        }
LAB_00130081:
        ptVar2->mlen = uVar4;
        ptVar2->slen = uVar4 - 1;
        puVar3[(long)(int)uVar4 + -1] = '\0';
        return ptVar2;
      }
    }
    else {
      iVar1 = (uVar9 - 1) * len;
      if (iVar1 <= (int)(uVar4 ^ 0x7fffffff)) {
        uVar4 = uVar4 + iVar1;
        puVar3 = (uchar *)malloc((long)(int)uVar4);
        ptVar2->data = puVar3;
        if (puVar3 != (uchar *)0x0) {
          sVar6 = (size_t)(*bl->entry)->slen;
          memcpy(puVar3,(*bl->entry)->data,sVar6);
          puVar3 = puVar3 + sVar6;
          for (lVar8 = 1; lVar8 < (int)uVar9; lVar8 = lVar8 + 1) {
            memcpy(puVar3,blk,(ulong)(uint)len);
            puVar3 = puVar3 + (uint)len;
            sVar6 = (size_t)bl->entry[lVar8]->slen;
            if (sVar6 != 0) {
              memcpy(puVar3,bl->entry[lVar8]->data,sVar6);
              puVar3 = puVar3 + sVar6;
            }
            uVar9 = bl->qty;
          }
          puVar3 = ptVar2->data;
          goto LAB_00130081;
        }
      }
    }
    free(ptVar2);
  }
  return (bstring)0x0;
}

Assistant:

bstring bjoinblk (const struct bstrList * bl, const void * blk, int len) {
bstring b;
unsigned char * p;
int i, c, v;

	if (bl == NULL || bl->qty < 0) return NULL;
	if (len < 0) return NULL;
	if (len > 0 && blk == NULL) return NULL;
	if (bl->qty < 1) return bfromStatic ("");

	for (i = 0, c = 1; i < bl->qty; i++) {
		v = bl->entry[i]->slen;
		if (v < 0) return NULL;	/* Invalid input */
		if (v > INT_MAX - c) return NULL;	/* Overflow */
		c += v;
	}

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (len == 0) {
		p = b->data = (unsigned char *) bstr__alloc (c);
		if (p == NULL) {
			bstr__free (b);
			return NULL;
		}
		for (i = 0; i < bl->qty; i++) {
			v = bl->entry[i]->slen;
			bstr__memcpy (p, bl->entry[i]->data, v);
			p += v;
		}
	} else {
		v = (bl->qty - 1) * len;
		if ((bl->qty > 512 || len > 127) &&
			v / len != bl->qty - 1) {
			bstr__free (b);
			return NULL; /* Overflow */
		}
		if (v > INT_MAX - c) {
			bstr__free (b);
			return NULL;    /* Overflow */
		}
		c += v;
		p = b->data = (unsigned char *) bstr__alloc (c);
		if (p == NULL) {
			bstr__free (b);
			return NULL;
		}
		v = bl->entry[0]->slen;
		bstr__memcpy (p, bl->entry[0]->data, v);
		p += v;
		for (i = 1; i < bl->qty; i++) {
			bstr__memcpy (p, blk, len);
			p += len;
			v = bl->entry[i]->slen;
			if (v) {
				bstr__memcpy (p, bl->entry[i]->data, v);
				p += v;
			}
		}
	}
	b->mlen = c;
	b->slen = c-1;
	b->data[c-1] = (unsigned char) '\0';
	return b;
}